

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O1

void Sim_SymmsAppendFromGroup
               (Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodesPi,Vec_Ptr_t *vNodesOther,Vec_Int_t *vSymms,
               int *pMap)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uSymm;
  int iVar4;
  long lVar5;
  long lVar6;
  long local_50;
  
  if ((vNodesPi->nSize != 0) && (0 < vNodesPi->nSize)) {
    local_50 = 1;
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      lVar6 = local_50;
      if (lVar1 < vNodesPi->nSize) {
        do {
          uVar2 = pMap[*(int *)(((ulong)vNodesPi->pArray[lVar5] & 0xfffffffffffffffe) + 0x10)];
          uVar3 = pMap[*(int *)(((ulong)vNodesPi->pArray[lVar6] & 0xfffffffffffffffe) + 0x10)];
          if (uVar2 == uVar3) {
            __assert_fail("pMap[pNode1->Id] != pMap[pNode2->Id]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf0,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          if ((int)uVar2 < 0) {
            __assert_fail("pMap[pNode1->Id] >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf1,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          if ((int)uVar3 < 0) {
            __assert_fail("pMap[pNode2->Id] >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf2,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          uSymm = uVar3 << 0x10 | uVar2;
          if ((int)uVar2 < (int)uVar3) {
            uSymm = uVar2 << 0x10 | uVar3;
          }
          iVar4 = Sim_SymmsIsCompatibleWithNodes(pNtk,uSymm,vNodesOther,(int *)(ulong)uVar3);
          if (iVar4 != 0) {
            Vec_IntPushUnique(vSymms,uSymm);
          }
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < vNodesPi->nSize);
      }
      local_50 = local_50 + 1;
      lVar5 = lVar1;
    } while (lVar1 < vNodesPi->nSize);
  }
  return;
}

Assistant:

void Sim_SymmsAppendFromGroup( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodesPi, Vec_Ptr_t * vNodesOther, Vec_Int_t * vSymms, int * pMap )
{
    Abc_Obj_t * pNode1, * pNode2;
    unsigned uSymm;
    int i, k;

    if ( vNodesPi->nSize == 0 )
        return;

    // go through the pairs
    for ( i = 0; i < vNodesPi->nSize; i++ )
    for ( k = i+1; k < vNodesPi->nSize; k++ )
    {
        // get the two PI nodes
        pNode1 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        pNode2 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[k]);
        assert( pMap[pNode1->Id] != pMap[pNode2->Id] );
        assert( pMap[pNode1->Id] >= 0 );
        assert( pMap[pNode2->Id] >= 0 );
        // generate symmetry
        if ( pMap[pNode1->Id] < pMap[pNode2->Id] )
            uSymm = ((pMap[pNode1->Id] << 16) | pMap[pNode2->Id]);
        else
            uSymm = ((pMap[pNode2->Id] << 16) | pMap[pNode1->Id]);
        // check if symmetry belongs
        if ( Sim_SymmsIsCompatibleWithNodes( pNtk, uSymm, vNodesOther, pMap ) )
            Vec_IntPushUnique( vSymms, (int)uSymm );
    }
}